

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbararealayout.cpp
# Opt level: O0

void __thiscall
QToolBarAreaLayout::getStyleOptionInfo
          (QToolBarAreaLayout *this,QStyleOptionToolBar *option,QToolBar *toolBar)

{
  int iVar1;
  QList<QToolBarAreaLayoutLine> *this_00;
  qsizetype qVar2;
  const_reference pQVar3;
  const_reference pQVar4;
  undefined4 extraout_var;
  long lVar5;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  int k;
  QToolBarAreaLayoutLine *line;
  int j;
  QToolBarAreaLayoutInfo *dock;
  int i;
  qsizetype in_stack_ffffffffffffff98;
  QList<QToolBarAreaLayoutLine> *in_stack_ffffffffffffffa0;
  int local_3c;
  int local_2c;
  int local_1c;
  
  local_1c = 0;
  do {
    if (3 < local_1c) {
      return;
    }
    this_00 = (QList<QToolBarAreaLayoutLine> *)(in_RDI + 0x18 + (long)local_1c * 0x38);
    for (local_2c = 0; qVar2 = QList<QToolBarAreaLayoutLine>::size(this_00), local_2c < qVar2;
        local_2c = local_2c + 1) {
      pQVar3 = QList<QToolBarAreaLayoutLine>::at
                         (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      for (local_3c = 0; qVar2 = QList<QToolBarAreaLayoutItem>::size(&pQVar3->toolBarItems),
          local_3c < qVar2; local_3c = local_3c + 1) {
        pQVar4 = QList<QToolBarAreaLayoutItem>::at
                           ((QList<QToolBarAreaLayoutItem> *)in_stack_ffffffffffffffa0,
                            in_stack_ffffffffffffff98);
        iVar1 = (*pQVar4->widgetItem->_vptr_QLayoutItem[0xd])();
        if (CONCAT44(extraout_var,iVar1) == in_RDX) {
          qVar2 = QList<QToolBarAreaLayoutItem>::size(&pQVar3->toolBarItems);
          if (qVar2 == 1) {
            *(undefined4 *)(in_RSI + 0x44) = 3;
          }
          else if (local_3c == 0) {
            *(undefined4 *)(in_RSI + 0x44) = 0;
          }
          else {
            lVar5 = (long)local_3c;
            qVar2 = QList<QToolBarAreaLayoutItem>::size(&pQVar3->toolBarItems);
            if (lVar5 == qVar2 + -1) {
              *(undefined4 *)(in_RSI + 0x44) = 2;
            }
            else {
              *(undefined4 *)(in_RSI + 0x44) = 1;
            }
          }
          qVar2 = QList<QToolBarAreaLayoutLine>::size(this_00);
          if (qVar2 == 1) {
            *(undefined4 *)(in_RSI + 0x40) = 3;
            return;
          }
          if (local_2c == 0) {
            *(undefined4 *)(in_RSI + 0x40) = 0;
            return;
          }
          lVar5 = (long)local_2c;
          qVar2 = QList<QToolBarAreaLayoutLine>::size(this_00);
          if (lVar5 == qVar2 + -1) {
            *(undefined4 *)(in_RSI + 0x40) = 2;
            return;
          }
          *(undefined4 *)(in_RSI + 0x40) = 1;
          return;
        }
      }
    }
    local_1c = local_1c + 1;
  } while( true );
}

Assistant:

void QToolBarAreaLayout::getStyleOptionInfo(QStyleOptionToolBar *option, QToolBar *toolBar) const
{
    for (int i = 0; i < QInternal::DockCount; ++i) {
        const QToolBarAreaLayoutInfo &dock = docks[i];

        for (int j = 0; j < dock.lines.size(); ++j) {
            const QToolBarAreaLayoutLine &line = dock.lines.at(j);

            for (int k = 0; k < line.toolBarItems.size(); ++k) {
                if (line.toolBarItems.at(k).widgetItem->widget() == toolBar) {
                    if (line.toolBarItems.size() == 1)
                        option->positionWithinLine = QStyleOptionToolBar::OnlyOne;
                    else if (k == 0)
                        option->positionWithinLine = QStyleOptionToolBar::Beginning;
                    else if (k == line.toolBarItems.size() - 1)
                        option->positionWithinLine = QStyleOptionToolBar::End;
                    else
                        option->positionWithinLine = QStyleOptionToolBar::Middle;

                    if (dock.lines.size() == 1)
                        option->positionOfLine = QStyleOptionToolBar::OnlyOne;
                    else if (j == 0)
                        option->positionOfLine = QStyleOptionToolBar::Beginning;
                    else if (j == dock.lines.size() - 1)
                        option->positionOfLine = QStyleOptionToolBar::End;
                    else
                        option->positionOfLine = QStyleOptionToolBar::Middle;

                    return;
                }
            }
        }
    }
}